

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O0

int * mxCallocInt(int n)

{
  char local_118 [8];
  char msg [256];
  int *buf;
  int i;
  int n_local;
  
  msg._248_8_ = superlu_malloc((long)n << 2);
  if ((void *)msg._248_8_ == (void *)0x0) {
    sprintf(local_118,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for buf in mxCallocInt()",
            0x44,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sp_coletree.c"
           );
    superlu_abort_and_exit(local_118);
  }
  for (buf._0_4_ = 0; (int)buf < n; buf._0_4_ = (int)buf + 1) {
    *(undefined4 *)(msg._248_8_ + (long)(int)buf * 4) = 0;
  }
  return (int *)msg._248_8_;
}

Assistant:

static 
int *mxCallocInt(int n)
{
    register int i;
    int *buf;

    buf = (int *) SUPERLU_MALLOC( n * sizeof(int) );
    if ( !buf ) {
         ABORT("SUPERLU_MALLOC fails for buf in mxCallocInt()");
       }
    for (i = 0; i < n; i++) buf[i] = 0;
    return (buf);
}